

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp:250:52)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_regexp_object_cpp:250:52)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  regexp_object *this_00;
  void *pvVar2;
  pointer v;
  gc_heap_ptr_untyped gStack_68;
  gc_heap_ptr_untyped local_58;
  value local_48;
  
  anon_unknown_35::check_type((anon_unknown_35 *)&local_58,&(this->f).global,this_);
  this_00 = (regexp_object *)gc_heap_ptr_untyped::get(&local_58);
  pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  if (v == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish) {
    v = (pointer)&value::undefined;
  }
  to_string((mjs *)&gStack_68,*(gc_heap **)((long)pvVar2 + 8),v);
  regexp_object::exec(&local_48,this_00,(string *)&gStack_68);
  bVar1 = operator!=(&local_48,(value *)value::null);
  __return_storage_ptr__->type_ = boolean;
  (__return_storage_ptr__->field_1).b_ = bVar1;
  value::~value(&local_48);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_58);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }